

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O0

void __thiscall
KDReports::AbstractTableElementPrivate::fillConstraints
          (AbstractTableElementPrivate *this,QTextTableFormat *tableFormat)

{
  bool bVar1;
  qsizetype asize;
  const_iterator o;
  qreal avalue;
  QTextLength local_98;
  QTextLength local_88;
  undefined1 local_78 [8];
  QTextLength length;
  ColumnConstraint *c;
  const_iterator __end2;
  const_iterator __begin2;
  QVector<KDReports::AbstractTableElement::ColumnConstraint> *__range2;
  undefined1 local_30 [8];
  QVector<QTextLength> constraints;
  QTextTableFormat *tableFormat_local;
  AbstractTableElementPrivate *this_local;
  
  constraints.d.size = (qsizetype)tableFormat;
  bVar1 = QList<KDReports::AbstractTableElement::ColumnConstraint>::isEmpty(&this->m_constraints);
  if (!bVar1) {
    QList<QTextLength>::QList((QList<QTextLength> *)local_30);
    asize = QList<KDReports::AbstractTableElement::ColumnConstraint>::size(&this->m_constraints);
    QList<QTextLength>::reserve((QList<QTextLength> *)local_30,asize);
    __end2 = QList<KDReports::AbstractTableElement::ColumnConstraint>::begin(&this->m_constraints);
    o = QList<KDReports::AbstractTableElement::ColumnConstraint>::end(&this->m_constraints);
    while (bVar1 = QList<KDReports::AbstractTableElement::ColumnConstraint>::const_iterator::
                   operator!=(&__end2,o), bVar1) {
      length.fixedValueOrPercentage =
           (qreal)QList<KDReports::AbstractTableElement::ColumnConstraint>::const_iterator::
                  operator*(&__end2);
      QTextLength::QTextLength((QTextLength *)local_78);
      if (*(int *)((long)length.fixedValueOrPercentage + 8) == 0) {
        avalue = mmToPixels(*(qreal *)length.fixedValueOrPercentage);
        QTextLength::QTextLength(&local_88,FixedLength,avalue);
        local_78 = (undefined1  [8])local_88._0_8_;
        length._0_8_ = local_88.fixedValueOrPercentage;
      }
      else if (*(int *)((long)length.fixedValueOrPercentage + 8) == 1) {
        QTextLength::QTextLength(&local_98,PercentageLength,*(qreal *)length.fixedValueOrPercentage)
        ;
        local_78 = (undefined1  [8])local_98._0_8_;
        length._0_8_ = local_98.fixedValueOrPercentage;
      }
      QList<QTextLength>::append((QList<QTextLength> *)local_30,(parameter_type)local_78);
      QList<KDReports::AbstractTableElement::ColumnConstraint>::const_iterator::operator++(&__end2);
    }
    QTextTableFormat::setColumnWidthConstraints
              ((QTextTableFormat *)constraints.d.size,(QList<QTextLength> *)local_30);
    QList<QTextLength>::~QList((QList<QTextLength> *)local_30);
  }
  return;
}

Assistant:

void KDReports::AbstractTableElementPrivate::fillConstraints(QTextTableFormat *tableFormat) const
{
    if (!m_constraints.isEmpty()) {
        QVector<QTextLength> constraints;
        constraints.reserve(m_constraints.size());
        for (const auto &c : m_constraints) {
            QTextLength length; // Variable by default
            switch (c.unit) {
            case Millimeters:
                length = QTextLength(QTextLength::FixedLength, mmToPixels(c.width));
                break;
            case Percent:
                length = QTextLength(QTextLength::PercentageLength, c.width);
                break;
            }
            constraints.append(length);
        }
        tableFormat->setColumnWidthConstraints(constraints);
    }
}